

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValueUnion unaff_RBX;
  JSRefCountHeader *p;
  JSValueUnion JVar4;
  JSValue JVar5;
  
  JVar2._4_4_ = in_register_0000000c;
  JVar2.int32 = argc;
  iVar3 = this_val.tag;
  JVar4 = this_val.u;
  if ((int)this_val.tag == -1) {
    bVar1 = true;
    if ((*(short *)((long)JVar4.ptr + 6) == 5) &&
       (iVar3 = *(int64_t *)((long)JVar4.ptr + 0x38), (int)iVar3 == -7)) {
      unaff_RBX = (JSValueUnion)((JSValueUnion *)((long)JVar4.ptr + 0x30))->ptr;
      *(int *)unaff_RBX.ptr = *unaff_RBX.ptr + 1;
      bVar1 = false;
    }
    JVar2 = JVar4;
    if (!bVar1) goto LAB_0016c4df;
  }
  else if ((int)this_val.tag == -7) {
    *(int *)JVar4.ptr = *JVar4.ptr + 1;
    unaff_RBX = JVar4;
    goto LAB_0016c4df;
  }
  unaff_RBX.float64 = 0.0;
  JS_ThrowTypeError(ctx,"not a string",iVar3,JVar2.float64);
  iVar3 = 6;
LAB_0016c4df:
  JVar5.tag = iVar3;
  JVar5.u.ptr = unaff_RBX.ptr;
  return JVar5;
}

Assistant:

static JSValue js_string_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    return js_thisStringValue(ctx, this_val);
}